

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

OPJ_BOOL opj_pi_next(opj_pi_iterator_t *pi)

{
  opj_pi_iterator_t *pi_local;
  
  switch((pi->poc).prg) {
  case OPJ_LRCP:
    pi_local._4_4_ = opj_pi_next_lrcp(pi);
    break;
  case OPJ_RLCP:
    pi_local._4_4_ = opj_pi_next_rlcp(pi);
    break;
  case OPJ_RPCL:
    pi_local._4_4_ = opj_pi_next_rpcl(pi);
    break;
  case OPJ_PCRL:
    pi_local._4_4_ = opj_pi_next_pcrl(pi);
    break;
  case OPJ_CPRL:
    pi_local._4_4_ = opj_pi_next_cprl(pi);
    break;
  case OPJ_PROG_UNKNOWN:
    pi_local._4_4_ = 0;
    break;
  default:
    pi_local._4_4_ = 0;
  }
  return pi_local._4_4_;
}

Assistant:

OPJ_BOOL opj_pi_next(opj_pi_iterator_t * pi)
{
    switch (pi->poc.prg) {
    case OPJ_LRCP:
        return opj_pi_next_lrcp(pi);
    case OPJ_RLCP:
        return opj_pi_next_rlcp(pi);
    case OPJ_RPCL:
        return opj_pi_next_rpcl(pi);
    case OPJ_PCRL:
        return opj_pi_next_pcrl(pi);
    case OPJ_CPRL:
        return opj_pi_next_cprl(pi);
    case OPJ_PROG_UNKNOWN:
        return OPJ_FALSE;
    }

    return OPJ_FALSE;
}